

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.hpp
# Opt level: O3

void __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::MSInstanceSampleMaskPattern
          (MSInstanceSampleMaskPattern *this,Context *context,ImageMSParams *imageMSParams)

{
  long lVar1;
  
  (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
  super_TestInstance.m_context = context;
  (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.m_imageMSParams
  .numSamples = imageMSParams->numSamples;
  lVar1 = 1;
  do {
    (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
    m_imageMSParams.imageSize.m_data[lVar1 + -1] = (imageMSParams->imageSize).m_data[lVar1 + -1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.m_imageType =
       IMAGE_TYPE_2D;
  (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.m_imageFormat.
  order = RGBA;
  (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.m_imageFormat.
  type = UNORM_INT8;
  (this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
  super_TestInstance._vptr_TestInstance = (_func_int **)&PTR__MSInstanceSampleMaskPattern_00d29170;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
  m_internal = 0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = 0;
  (this->m_buffer).
  super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr =
       (Buffer *)0x0;
  *(uint *)&(this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
            field_0x2c =
       ~(-1 << ((char)imageMSParams->numSamples &
               (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT))) & 0x2aaaaaaa;
  return;
}

Assistant:

TestInstance	(Context& context) : m_context(context) {}